

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnrealLoader.cpp
# Opt level: O3

void __thiscall
Assimp::UnrealImporter::InternReadFile
          (UnrealImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  char *pcVar1;
  int8_t **ppiVar2;
  char *__s;
  undefined1 uVar3;
  _Alloc_hider _Var4;
  aiMatrix4x4 *out;
  float fVar5;
  SharedPostProcessInfo *pSVar6;
  char cVar7;
  uchar uVar8;
  byte bVar9;
  ushort uVar10;
  ushort uVar11;
  short sVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  Logger *pLVar16;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  aiNode *this_01;
  IOStream *stream;
  pointer __s2;
  __normal_iterator<Assimp::Unreal::TempMat_*,_std::vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>_>
  _Var17;
  aiMesh **ppaVar18;
  aiMaterial **ppaVar19;
  uint *puVar20;
  aiMesh *paVar21;
  ulong *puVar22;
  aiFace *paVar23;
  aiVector3D *paVar24;
  aiMaterial *this_02;
  size_t sVar25;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar26;
  runtime_error *prVar27;
  char cVar28;
  uint uVar29;
  aiFace *paVar30;
  Triangle *tri;
  aiMatrix4x4 *paVar31;
  pointer pTVar32;
  pointer pTVar33;
  pointer pTVar34;
  aiScene *pScene_00;
  uint i;
  long lVar35;
  ulong uVar36;
  aiVector3t<float> *vertex;
  pointer paVar37;
  ulong uVar38;
  int twosided;
  vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_> materials;
  FlipWindingOrderProcess flipper;
  vector<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  textures;
  vector<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_> triangles;
  StreamReaderLE d_reader;
  string extension;
  string a_path;
  string d_path;
  string uc_path;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> vertices;
  MakeLeftHandedProcess hero;
  StreamReaderLE a_reader;
  undefined4 local_5dc;
  vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_> local_5d8;
  aiScene *local_5c0;
  FlipWindingOrderProcess local_5b8;
  aiMatrix4x4 *local_598;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_590;
  aiMatrix4x4 *local_588;
  long *local_580;
  vector<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_578;
  vector<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_> local_560;
  StreamReader<false,_false> local_548;
  string local_510;
  char *local_4f0;
  long local_4e8;
  char local_4e0 [16];
  char *local_4d0;
  long local_4c8;
  char local_4c0 [16];
  char *local_4b0;
  long local_4a8;
  char local_4a0 [16];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_490;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_488;
  undefined1 local_470 [12];
  char acStack_464 [4];
  undefined1 local_460 [24];
  size_type local_448;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_440 [4];
  ios_base local_400 [920];
  StreamReader<false,_false> local_68;
  undefined4 extraout_var_03;
  
  std::__cxx11::string::rfind((char)pFile,0x2e);
  BaseImporter::GetExtension(&local_510,pFile);
  local_4d0 = local_4c0;
  local_4c8 = 0;
  local_4c0[0] = '\0';
  local_4f0 = local_4e0;
  local_4e8 = 0;
  local_4e0[0] = '\0';
  local_4b0 = local_4a0;
  local_4a8 = 0;
  local_4a0[0] = '\0';
  iVar13 = std::__cxx11::string::compare((char *)&local_510);
  if (iVar13 == 0) {
    lVar35 = std::__cxx11::string::rfind((char)pFile,0x5f);
    if (lVar35 == -1) {
      prVar27 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_470._0_8_ = local_460;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_470,"UNREAL: Unexpected naming scheme","");
      std::runtime_error::runtime_error(prVar27,(string *)local_470);
      *(undefined ***)prVar27 = &PTR__runtime_error_008dc448;
      __cxa_throw(prVar27,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::substr((ulong)local_470,(ulong)pFile);
  }
  else {
    std::__cxx11::string::substr((ulong)local_470,(ulong)pFile);
  }
  std::__cxx11::string::operator=((string *)&local_510,(string *)local_470);
  if ((undefined1 *)CONCAT44(local_470._4_4_,local_470._0_4_) != local_460) {
    operator_delete((undefined1 *)CONCAT44(local_470._4_4_,local_470._0_4_));
  }
  local_470._0_8_ = local_460;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_470,local_510._M_dataplus._M_p,
             local_510._M_dataplus._M_p + local_510._M_string_length);
  std::__cxx11::string::append(local_470);
  std::__cxx11::string::operator=((string *)&local_4d0,(string *)local_470);
  if ((undefined1 *)local_470._0_8_ != local_460) {
    operator_delete((void *)local_470._0_8_);
  }
  local_470._0_8_ = local_460;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_470,local_510._M_dataplus._M_p,
             local_510._M_dataplus._M_p + local_510._M_string_length);
  std::__cxx11::string::append(local_470);
  std::__cxx11::string::operator=((string *)&local_4f0,(string *)local_470);
  if ((undefined1 *)local_470._0_8_ != local_460) {
    operator_delete((void *)local_470._0_8_);
  }
  local_470._0_8_ = local_460;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_470,local_510._M_dataplus._M_p,
             local_510._M_dataplus._M_p + local_510._M_string_length);
  std::__cxx11::string::append(local_470);
  std::__cxx11::string::operator=((string *)&local_4b0,(string *)local_470);
  if ((undefined1 *)local_470._0_8_ != local_460) {
    operator_delete((void *)local_470._0_8_);
  }
  pLVar16 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[22]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_470,
             (char (*) [22])"UNREAL: data file is ");
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_470,local_4d0,local_4c8);
  std::__cxx11::stringbuf::str();
  Logger::debug(pLVar16,(char *)local_548.stream.
                                super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
  ppiVar2 = &local_548.buffer;
  if (local_548.stream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)ppiVar2) {
    operator_delete(local_548.stream.
                    super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_470);
  std::ios_base::~ios_base(local_400);
  pLVar16 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[22]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_470,
             (char (*) [22])"UNREAL: aniv file is ");
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_470,local_4f0,local_4e8);
  std::__cxx11::stringbuf::str();
  Logger::debug(pLVar16,(char *)local_548.stream.
                                super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
  if (local_548.stream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)ppiVar2) {
    operator_delete(local_548.stream.
                    super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_470);
  std::ios_base::~ios_base(local_400);
  pLVar16 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[20]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_470,
             (char (*) [20])"UNREAL: uc file is ");
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_470,local_4b0,local_4a8);
  std::__cxx11::stringbuf::str();
  Logger::debug(pLVar16,(char *)local_548.stream.
                                super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
  if (local_548.stream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)ppiVar2) {
    operator_delete(local_548.stream.
                    super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_470);
  std::ios_base::~ios_base(local_400);
  local_470._0_8_ = local_460;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_470,"rb","");
  iVar13 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,local_4d0,local_470._0_8_);
  if ((undefined1 *)local_470._0_8_ != local_460) {
    operator_delete((void *)local_470._0_8_);
  }
  if ((long *)CONCAT44(extraout_var,iVar13) == (long *)0x0) {
    prVar27 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_470._0_8_ = local_460;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_470,"UNREAL: Unable to open _d file","");
    std::runtime_error::runtime_error(prVar27,(string *)local_470);
    *(undefined ***)prVar27 = &PTR__runtime_error_008dc448;
    __cxa_throw(prVar27,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_470._0_8_ = local_460;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_470,"rb","");
  iVar14 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,local_4d0,local_470._0_8_);
  StreamReader<false,_false>::StreamReader
            (&local_548,(IOStream *)CONCAT44(extraout_var_00,iVar14),false);
  if ((undefined1 *)local_470._0_8_ != local_460) {
    operator_delete((void *)local_470._0_8_);
  }
  uVar10 = StreamReader<false,_false>::Get<short>(&local_548);
  uVar11 = StreamReader<false,_false>::Get<short>(&local_548);
  StreamReader<false,_false>::IncPtr(&local_548,0x2c);
  if ((uVar10 == 0) || (uVar11 < 3)) {
    prVar27 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_470._0_8_ = local_460;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_470,"UNREAL: Invalid number of vertices/triangles","");
    std::runtime_error::runtime_error(prVar27,(string *)local_470);
    *(undefined ***)prVar27 = &PTR__runtime_error_008dc448;
    __cxa_throw(prVar27,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_588 = (aiMatrix4x4 *)CONCAT62(local_588._2_6_,uVar11);
  local_5c0 = pScene;
  std::vector<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>::vector
            (&local_560,(ulong)uVar10,(allocator_type *)local_470);
  pTVar34 = local_560.
            super__Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (local_560.
      super__Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_560.
      super__Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pTVar32 = local_560.
              super__Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      lVar35 = 0;
      do {
        uVar11 = StreamReader<false,_false>::Get<short>(&local_548);
        pTVar32->mVertex[lVar35] = uVar11;
        if (uVar10 <= uVar11) {
          pLVar16 = DefaultLogger::get();
          Logger::warn(pLVar16,"UNREAL: vertex index out of range");
          pTVar32->mVertex[lVar35] = 0;
        }
        lVar35 = lVar35 + 1;
      } while (lVar35 != 3);
      cVar7 = StreamReader<false,_false>::Get<signed_char>(&local_548);
      pTVar32->mType = cVar7;
      if (this->configHandleFlags == false) {
        cVar28 = '\x01';
        if ((byte)(cVar7 - 3U) < 2) goto LAB_005fc563;
      }
      else {
        cVar28 = '\0';
LAB_005fc563:
        pTVar32->mType = cVar28;
      }
      StreamReader<false,_false>::IncPtr(&local_548,1);
      lVar35 = 4;
      do {
        cVar7 = StreamReader<false,_false>::Get<signed_char>(&local_548);
        *(char *)(pTVar32->mVertex + lVar35) = cVar7;
        cVar7 = StreamReader<false,_false>::Get<signed_char>(&local_548);
        *(char *)((long)pTVar32->mVertex + lVar35 * 2 + 1) = cVar7;
        lVar35 = lVar35 + 1;
      } while (lVar35 != 7);
      uVar8 = StreamReader<false,_false>::Get<signed_char>(&local_548);
      pTVar32->mTextureNum = uVar8;
      StreamReader<false,_false>::IncPtr(&local_548,1);
      pTVar32 = pTVar32 + 1;
    } while (pTVar32 != pTVar34);
  }
  local_470._0_8_ = local_460;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_470,"rb","");
  iVar14 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,local_4f0,local_470._0_8_);
  pScene_00 = local_5c0;
  local_580 = (long *)CONCAT44(extraout_var_01,iVar14);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar13) + 8))();
  if ((undefined1 *)local_470._0_8_ != local_460) {
    operator_delete((void *)local_470._0_8_);
  }
  paVar31 = local_588;
  uVar10 = (ushort)local_588;
  if (local_580 == (long *)0x0) {
    prVar27 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_470._0_8_ = local_460;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_470,"UNREAL: Unable to open _a file","");
    std::runtime_error::runtime_error(prVar27,(string *)local_470);
    *(undefined ***)prVar27 = &PTR__runtime_error_008dc448;
    __cxa_throw(prVar27,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_470._0_8_ = local_460;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_470,"rb","");
  iVar13 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,local_4f0,local_470._0_8_);
  StreamReader<false,_false>::StreamReader
            (&local_68,(IOStream *)CONCAT44(extraout_var_02,iVar13),false);
  if ((undefined1 *)local_470._0_8_ != local_460) {
    operator_delete((void *)local_470._0_8_);
  }
  sVar12 = StreamReader<false,_false>::Get<short>(&local_68);
  if ((uint)(int)sVar12 <= this->configFrameID) {
    prVar27 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_470._0_8_ = local_460;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_470,"UNREAL: The requested frame does not exist","");
    std::runtime_error::runtime_error(prVar27,(string *)local_470);
    *(undefined ***)prVar27 = &PTR__runtime_error_008dc448;
    __cxa_throw(prVar27,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  sVar12 = StreamReader<false,_false>::Get<short>(&local_68);
  if ((uint)uVar10 * 4 != (int)sVar12) {
    prVar27 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_470._0_8_ = local_460;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_470,"UNREAL: Unexpected aniv file length","");
    std::runtime_error::runtime_error(prVar27,(string *)local_470);
    *(undefined ***)prVar27 = &PTR__runtime_error_008dc448;
    __cxa_throw(prVar27,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  StreamReader<false,_false>::IncPtr(&local_68,(ulong)((int)sVar12 * this->configFrameID));
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
            (&local_488,(ulong)paVar31 & 0xffff,(allocator_type *)local_470);
  if (local_488.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_488.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    paVar37 = local_488.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      iVar13 = StreamReader<false,_false>::Get<int>(&local_68);
      paVar37->x = (float)((iVar13 << 0x15) >> 0x15);
      paVar37->y = (float)((iVar13 << 10) >> 0x15);
      paVar37->z = (float)(iVar13 >> 0x16);
      paVar37 = paVar37 + 1;
    } while (paVar37 !=
             local_488.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  local_578.
  super__Vector_base<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_578.
  super__Vector_base<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_578.
  super__Vector_base<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_01 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_01);
  pScene_00->mRootNode = this_01;
  (this_01->mName).length = 0xc;
  builtin_strncpy((this_01->mName).data,"<UnrealRoot>",0xd);
  local_470._0_8_ = local_460;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_470,"rb","");
  iVar13 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,local_4b0,local_470._0_8_);
  stream = (IOStream *)CONCAT44(extraout_var_03,iVar13);
  if ((undefined1 *)local_470._0_8_ != local_460) {
    operator_delete((void *)local_470._0_8_);
  }
  if (stream == (IOStream *)0x0) {
    pLVar16 = DefaultLogger::get();
    Logger::error(pLVar16,"Unable to open .uc file");
  }
  else {
    local_5d8.super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_5d8.super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_5d8.super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    BaseImporter::TextFileToBuffer
              (stream,(vector<char,_std::allocator<char>_> *)&local_5d8,FORBID_EMPTY);
    local_5b8.super_BaseProcess._vptr_BaseProcess = (_func_int **)0x0;
    local_5b8.super_BaseProcess.shared = (SharedPostProcessInfo *)0x0;
    local_5b8.super_BaseProcess.progress = (ProgressHandler *)0x0;
    if ((char)(local_5d8.
               super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
               ._M_impl.super__Vector_impl_data._M_start)->type != MF_NORMAL_OS) {
      paVar31 = (aiMatrix4x4 *)&(this_01->mTransformation).c3;
      local_588 = &this_01->mTransformation;
      pTVar33 = local_5d8.
                super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_598 = paVar31;
      do {
        iVar13 = strncasecmp("#exec",(char *)pTVar33,5);
        __s2 = pTVar33;
        if (((iVar13 == 0) && (uVar36 = (ulong)*(byte *)((long)&pTVar33->tex + 1), uVar36 < 0x21))
           && ((0x100003601U >> (uVar36 & 0x3f) & 1) != 0)) {
          pTVar33 = (pointer)((long)&pTVar33[1].type + 2);
          while ((uVar36 = (ulong)(byte)pTVar33[-1].tex, uVar36 < 0x21 &&
                 ((0x100002600U >> (uVar36 & 0x3f) & 1) != 0))) {
            pTVar33 = (pointer)((long)&pTVar33->type + 1);
          }
          __s2 = (pointer)&pTVar33[-1].tex;
          iVar13 = strncasecmp("TEXTURE",(char *)__s2,7);
          if (((iVar13 == 0) &&
              (uVar36 = (ulong)*(byte *)((long)&pTVar33[-1].numFaces + 3), uVar36 < 0x21)) &&
             ((0x100003601U >> (uVar36 & 0x3f) & 1) != 0)) {
            while ((uVar36 = (ulong)(byte)(char)pTVar33->type, uVar36 < 0x21 &&
                   ((0x100002600U >> (uVar36 & 0x3f) & 1) != 0))) {
              pTVar33 = (pointer)((long)&pTVar33->type + 1);
            }
            iVar13 = strncasecmp("IMPORT",(char *)pTVar33,6);
            __s2 = pTVar33;
            if (((iVar13 == 0) &&
                (uVar36 = (ulong)*(byte *)((long)&pTVar33->tex + 2), uVar36 < 0x21)) &&
               ((0x100003601U >> (uVar36 & 0x3f) & 1) != 0)) {
              local_470._8_4_ = 0;
              acStack_464[0] = '\0';
              acStack_464[1] = '\0';
              acStack_464[2] = '\0';
              acStack_464[3] = '\0';
              local_460._0_8_ = local_460._0_8_ & 0xffffffffffffff00;
              local_448 = 0;
              local_440[0]._M_local_buf[0] = '\0';
              local_460._16_8_ = local_440;
              local_470._0_8_ = local_460;
              std::
              vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
              ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                          *)&local_5b8,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_470);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_460._16_8_ != local_440) {
                operator_delete((void *)local_460._16_8_);
              }
              if ((undefined1 *)local_470._0_8_ != local_460) {
                operator_delete((void *)local_470._0_8_);
              }
              pSVar6 = local_5b8.super_BaseProcess.shared;
              __s2 = (pointer)((long)&pTVar33->tex + 3);
              local_590 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)((long)local_5b8.super_BaseProcess.shared + -0x40);
              local_490 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)((long)local_5b8.super_BaseProcess.shared + -0x40))->second;
              while ((uVar15 = (uint)(byte)(char)__s2->type, 0xd < uVar15 ||
                     ((0x3401U >> (uVar15 & 0x1f) & 1) == 0))) {
                iVar13 = strncasecmp((char *)__s2,"NAME=",5);
                if (iVar13 == 0) {
                  pTVar33 = (pointer)((long)&__s2->tex + 1);
                  __s2 = pTVar33;
                  while ((uVar36 = (ulong)(byte)(char)__s2->type, 0x20 < uVar36 ||
                         ((0x100003601U >> (uVar36 & 0x3f) & 1) == 0))) {
                    __s2 = (pointer)((long)&__s2->type + 1);
                  }
                  local_470._0_8_ = local_460;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_470,pTVar33,__s2);
                  ppVar26 = local_590;
LAB_005fcba7:
                  std::__cxx11::string::operator=((string *)ppVar26,(string *)local_470);
                  if ((undefined1 *)local_470._0_8_ != local_460) {
                    operator_delete((void *)local_470._0_8_);
                  }
                }
                else {
                  iVar13 = strncasecmp((char *)__s2,"FILE=",5);
                  if (iVar13 == 0) {
                    pTVar33 = (pointer)((long)&__s2->tex + 1);
                    __s2 = pTVar33;
                    while ((uVar36 = (ulong)(byte)(char)__s2->type, 0x20 < uVar36 ||
                           ((0x100003601U >> (uVar36 & 0x3f) & 1) == 0))) {
                      __s2 = (pointer)((long)&__s2->type + 1);
                    }
                    local_470._0_8_ = local_460;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_470,pTVar33,__s2);
                    ppVar26 = local_490;
                    goto LAB_005fcba7;
                  }
                }
                __s2 = (pointer)((long)&__s2->type + 1);
              }
              if (((((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)((long)pSVar6 + -0x40))->first)._M_string_length == 0) ||
                 ((((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)((long)pSVar6 + -0x40))->second)._M_string_length == 0)) {
                local_5b8.super_BaseProcess.shared =
                     (SharedPostProcessInfo *)((long)local_5b8.super_BaseProcess.shared + -0x40);
                __gnu_cxx::new_allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>::
                destroy<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((new_allocator<std::pair<std::__cxx11::string,std::__cxx11::string>> *)
                           &local_5b8,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_5b8.super_BaseProcess.shared);
              }
              paVar31 = local_598;
              pScene_00 = local_5c0;
            }
          }
          else {
            iVar13 = strncasecmp("MESHMAP",(char *)__s2,7);
            if (((iVar13 == 0) &&
                (uVar36 = (ulong)*(byte *)((long)&pTVar33[-1].numFaces + 3), uVar36 < 0x21)) &&
               ((0x100003601U >> (uVar36 & 0x3f) & 1) != 0)) {
              while ((uVar36 = (ulong)(byte)(char)pTVar33->type, uVar36 < 0x21 &&
                     ((0x100002600U >> (uVar36 & 0x3f) & 1) != 0))) {
                pTVar33 = (pointer)((long)&pTVar33->type + 1);
              }
              iVar13 = strncasecmp("SETTEXTURE",(char *)pTVar33,10);
              if (((iVar13 == 0) &&
                  (uVar36 = (ulong)*(byte *)((long)&pTVar33->numFaces + 2), uVar36 < 0x21)) &&
                 ((0x100003601U >> (uVar36 & 0x3f) & 1) != 0)) {
                local_470._0_4_ = MF_NORMAL_OS;
                local_460._0_8_ = 0;
                local_460[8] = '\0';
                unique0x10002eee = local_460 + 8;
                std::
                vector<std::pair<unsigned_int,std::__cxx11::string>,std::allocator<std::pair<unsigned_int,std::__cxx11::string>>>
                ::emplace_back<std::pair<unsigned_int,std::__cxx11::string>>
                          ((vector<std::pair<unsigned_int,std::__cxx11::string>,std::allocator<std::pair<unsigned_int,std::__cxx11::string>>>
                            *)&local_578,
                           (pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_470);
                if (stack0xfffffffffffffb98 != local_460 + 8) {
                  operator_delete(stack0xfffffffffffffb98);
                }
                __s2 = (pointer)((long)&pTVar33->numFaces + 3);
                local_590 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_578.
                               super__Vector_base<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                this_00 = &((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)((long)local_578.
                                      super__Vector_base<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish + -0x40))->second;
                while ((uVar15 = (uint)(byte)(char)__s2->type, 0xd < uVar15 ||
                       (pScene_00 = local_5c0, (0x3401U >> (uVar15 & 0x1f) & 1) == 0))) {
                  iVar13 = strncasecmp((char *)__s2,"NUM=",4);
                  if (iVar13 == 0) {
                    bVar9 = (byte)__s2->tex;
                    __s2 = (pointer)&__s2->tex;
                    iVar13 = 0;
                    if (0xf5 < (byte)(bVar9 - 0x3a)) {
                      iVar13 = 0;
                      do {
                        iVar13 = (uint)(byte)(bVar9 - 0x30) + iVar13 * 10;
                        bVar9 = *(byte *)((long)&__s2->type + 1);
                        __s2 = (pointer)((long)&__s2->type + 1);
                      } while (0xf5 < (byte)(bVar9 - 0x3a));
                    }
                    *(int *)((long)&local_590[-1].first.field_2 + 8) = iVar13;
                  }
                  else {
                    iVar13 = strncasecmp((char *)__s2,"TEXTURE=",8);
                    if (iVar13 == 0) {
                      puVar20 = &__s2->numFaces;
                      __s2 = (pointer)puVar20;
                      while ((uVar36 = (ulong)(byte)(char)__s2->type, 0x20 < uVar36 ||
                             ((0x100003601U >> (uVar36 & 0x3f) & 1) == 0))) {
                        __s2 = (pointer)((long)&__s2->type + 1);
                      }
                      local_470._0_8_ = local_460;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_470,puVar20,__s2);
                      std::__cxx11::string::operator=((string *)this_00,(string *)local_470);
                      if ((undefined1 *)local_470._0_8_ != local_460) {
                        operator_delete((void *)local_470._0_8_);
                      }
                      pSVar6 = local_5b8.super_BaseProcess.shared;
                      paVar31 = local_598;
                      if ((SharedPostProcessInfo *)local_5b8.super_BaseProcess._vptr_BaseProcess !=
                          local_5b8.super_BaseProcess.shared) {
                        sVar25 = local_590[-1].second._M_string_length;
                        ppVar26 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)local_5b8.super_BaseProcess._vptr_BaseProcess;
                        do {
                          if ((ppVar26->first)._M_string_length == sVar25) {
                            if (sVar25 != 0) {
                              iVar13 = bcmp((ppVar26->first)._M_dataplus._M_p,
                                            (this_00->_M_dataplus)._M_p,sVar25);
                              if (iVar13 != 0) goto LAB_005fcdfc;
                            }
                            std::__cxx11::string::_M_assign((string *)this_00);
                            paVar31 = local_598;
                            break;
                          }
LAB_005fcdfc:
                          ppVar26 = ppVar26 + 1;
                          paVar31 = local_598;
                        } while (ppVar26 !=
                                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)pSVar6);
                      }
                    }
                  }
                  __s2 = (pointer)((long)&__s2->type + 1);
                }
              }
              else {
                iVar13 = strncasecmp("SCALE",(char *)pTVar33,5);
                __s2 = pTVar33;
                if (((iVar13 == 0) &&
                    (uVar36 = (ulong)*(byte *)((long)&pTVar33->tex + 1), uVar36 < 0x21)) &&
                   ((0x100003601U >> (uVar36 & 0x3f) & 1) != 0)) {
                  __s2 = (pointer)((long)&pTVar33->tex + 2);
                  do {
                    uVar3 = (undefined1)__s2->type;
                    uVar15 = (uint)(byte)uVar3;
                    if ((byte)uVar3 < 0x59) {
                      if (uVar3 == 0x58) {
                        bVar9 = *(byte *)((long)&__s2->type + 1);
                        out = local_588;
                        goto joined_r0x005fce99;
                      }
                      if (((byte)uVar3 < (MF_WEAPON_PLACEHOLDER|MF_NORMAL_MOD_TS|MF_NORMAL_TRANS_TS)
                          ) && ((0x3401U >> (uVar15 & 0x1f) & 1) != 0)) break;
                    }
                    else {
                      if (uVar15 == 0x59) {
                        bVar9 = *(byte *)((long)&__s2->type + 1);
                        out = (aiMatrix4x4 *)&(this_01->mTransformation).b2;
                      }
                      else {
                        if (uVar15 != 0x5a) goto LAB_005fceaf;
                        bVar9 = *(byte *)((long)&__s2->type + 1);
                        out = paVar31;
                      }
joined_r0x005fce99:
                      if (bVar9 == 0x3d) {
                        __s2 = (pointer)fast_atoreal_move<float>
                                                  ((char *)((long)&__s2->type + 2),&out->a1,true);
                      }
                    }
LAB_005fceaf:
                    __s2 = (pointer)((long)&__s2->type + 1);
                  } while( true );
                }
              }
            }
          }
        }
        pTVar33 = (pointer)((long)&__s2->type + 1);
      } while (*(byte *)((long)&__s2->type + 1) != 0);
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_5b8);
    if (local_5d8.
        super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_5d8.
                      super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  local_5d8.super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5d8.super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
  _M_impl.super__Vector_impl_data._M_finish = (TempMat *)0x0;
  local_5d8.super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (TempMat *)0x0;
  std::vector<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>::reserve
            (&local_5d8,
             ((long)local_578.
                    super__Vector_base<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_578.
                    super__Vector_base<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x6666666666666666 + 5);
  pTVar34 = local_560.
            super__Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (local_560.
      super__Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_560.
      super__Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pTVar32 = local_560.
              super__Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_470._0_4_ = SEXT14(pTVar32->mType);
      local_470._4_4_ = ZEXT14(pTVar32->mTextureNum);
      local_470._8_4_ = 0;
      _Var17 = std::
               __find_if<__gnu_cxx::__normal_iterator<Assimp::Unreal::TempMat*,std::vector<Assimp::Unreal::TempMat,std::allocator<Assimp::Unreal::TempMat>>>,__gnu_cxx::__ops::_Iter_equals_val<Assimp::Unreal::TempMat_const>>
                         (local_5d8.
                          super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          local_5d8.
                          super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                          ._M_impl.super__Vector_impl_data._M_finish,(TempMat *)local_470);
      pTVar32->matIndex =
           (int)((ulong)((long)_Var17._M_current -
                        (long)local_5d8.
                              super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
      if (_Var17._M_current ==
          local_5d8.
          super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        local_470._8_4_ = 1;
        if (_Var17._M_current ==
            local_5d8.
            super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<Assimp::Unreal::TempMat,std::allocator<Assimp::Unreal::TempMat>>::
          _M_realloc_insert<Assimp::Unreal::TempMat_const&>
                    ((vector<Assimp::Unreal::TempMat,std::allocator<Assimp::Unreal::TempMat>> *)
                     &local_5d8,
                     (iterator)
                     local_5d8.
                     super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(TempMat *)local_470);
        }
        else {
          (local_5d8.
           super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
           _M_impl.super__Vector_impl_data._M_finish)->numFaces = 1;
          (local_5d8.
           super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
           _M_impl.super__Vector_impl_data._M_finish)->type = local_470._0_4_;
          (local_5d8.
           super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
           _M_impl.super__Vector_impl_data._M_finish)->tex = local_470._4_4_;
          local_5d8.
          super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_5d8.
               super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        pScene_00->mNumMeshes = pScene_00->mNumMeshes + 1;
      }
      else {
        (_Var17._M_current)->numFaces = (_Var17._M_current)->numFaces + 1;
      }
      pTVar32 = pTVar32 + 1;
    } while (pTVar32 != pTVar34);
  }
  uVar15 = pScene_00->mNumMeshes;
  uVar36 = (ulong)uVar15;
  if (uVar36 == 0) {
    prVar27 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_470._0_8_ = local_460;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_470,"UNREAL: Unable to find valid mesh data","");
    std::runtime_error::runtime_error(prVar27,(string *)local_470);
    *(undefined ***)prVar27 = &PTR__runtime_error_008dc448;
    __cxa_throw(prVar27,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  ppaVar18 = (aiMesh **)operator_new__(uVar36 * 8);
  pScene_00->mMeshes = ppaVar18;
  pScene_00->mNumMaterials = uVar15;
  ppaVar19 = (aiMaterial **)operator_new__(uVar36 * 8);
  pScene_00->mMaterials = ppaVar19;
  this_01->mNumMeshes = uVar15;
  puVar20 = (uint *)operator_new__(uVar36 << 2);
  this_01->mMeshes = puVar20;
  uVar36 = 0;
  _Var4._M_p = stack0xfffffffffffffb98;
  do {
    unique0x10002f1e = _Var4._M_p;
    paVar21 = (aiMesh *)operator_new(0x520);
    paVar21->mNumVertices = 0;
    paVar21->mNumFaces = 0;
    memset(&paVar21->mVertices,0,0xcc);
    paVar21->mBones = (aiBone **)0x0;
    paVar21->mMaterialIndex = 0;
    (paVar21->mName).length = 0;
    (paVar21->mName).data[0] = '\0';
    memset((paVar21->mName).data + 1,0x1b,0x3ff);
    paVar21->mNumAnimMeshes = 0;
    paVar21->mAnimMeshes = (aiAnimMesh **)0x0;
    paVar21->mMethod = 0;
    (paVar21->mAABB).mMin.x = 0.0;
    (paVar21->mAABB).mMin.y = 0.0;
    (paVar21->mAABB).mMin.z = 0.0;
    (paVar21->mAABB).mMax.x = 0.0;
    (paVar21->mAABB).mMax.y = 0.0;
    (paVar21->mAABB).mMax.z = 0.0;
    memset(paVar21->mColors,0,0xa0);
    pScene_00->mMeshes[uVar36] = paVar21;
    paVar21->mPrimitiveTypes = 4;
    uVar15 = local_5d8.
             super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar36].numFaces;
    uVar38 = (ulong)uVar15;
    puVar22 = (ulong *)operator_new__(uVar38 * 0x10 + 8);
    *puVar22 = uVar38;
    paVar23 = (aiFace *)(puVar22 + 1);
    if (uVar38 != 0) {
      paVar30 = paVar23;
      do {
        paVar30->mNumIndices = 0;
        paVar30->mIndices = (uint *)0x0;
        paVar30 = paVar30 + 1;
      } while (paVar30 != paVar23 + uVar38);
    }
    paVar21->mFaces = paVar23;
    uVar38 = (ulong)(uVar15 * 3) * 0xc;
    paVar24 = (aiVector3D *)operator_new__(uVar38);
    if (uVar15 != 0) {
      memset(paVar24,0,((uVar38 - 0xc) / 0xc) * 0xc + 0xc);
    }
    paVar21->mVertices = paVar24;
    paVar24 = (aiVector3D *)operator_new__(uVar38);
    if (uVar15 != 0) {
      memset(paVar24,0,((uVar38 - 0xc) / 0xc) * 0xc + 0xc);
    }
    paVar21->mTextureCoords[0] = paVar24;
    this_01->mMeshes[uVar36] = (uint)uVar36;
    this_02 = (aiMaterial *)operator_new(0x10);
    aiMaterial::aiMaterial(this_02);
    pScene_00 = local_5c0;
    __s = local_470 + 4;
    local_5c0->mMaterials[uVar36] = this_02;
    local_5b8.super_BaseProcess._vptr_BaseProcess = (_func_int **)0x3f8000003f800000;
    local_5b8.super_BaseProcess.shared =
         (SharedPostProcessInfo *)CONCAT44(local_5b8.super_BaseProcess.shared._4_4_,0x3f800000);
    local_470._0_4_ = MF_NORMAL_OS;
    local_470._4_4_ = local_470._4_4_ & 0xffffff00;
    memset(local_470 + 5,0x1b,0x3ff);
    snprintf(__s,0x400,"mat%u_tx%u_",uVar36 & 0xffffffff);
    pTVar33 = local_5d8.
              super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (local_5d8.
        super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar36].type == MF_NORMAL_TS) {
      local_5dc = 1;
      aiMaterial::AddBinaryProperty(this_02,&local_5dc,4,"$mat.twosided",0,0,aiPTI_Integer);
      sVar25 = strlen(__s);
      *(undefined4 *)(local_470 + sVar25 + 4) = 0x5f7374;
      pTVar33 = local_5d8.
                super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    else {
      sVar25 = strlen(__s);
      *(undefined4 *)(local_470 + sVar25 + 4) = 0x5f736f;
    }
    if (pTVar33[uVar36].type == MF_NORMAL_TRANS_TS) {
      local_5dc = 0x3f666666;
      aiMaterial::AddBinaryProperty(this_02,&local_5dc,4,"$mat.opacity",0,0,aiPTI_Float);
      sVar25 = strlen(__s);
      pcVar1 = __s + sVar25;
      pcVar1[0] = 't';
      pcVar1[1] = 'r';
      pcVar1[2] = 'a';
      pcVar1[3] = 'n';
      *(undefined2 *)(local_470 + sVar25 + 8) = 0x5f;
      pTVar33 = local_5d8.
                super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    else {
      sVar25 = strlen(__s);
      pcVar1 = __s + sVar25;
      pcVar1[0] = 'o';
      pcVar1[1] = 'p';
      pcVar1[2] = 'a';
      pcVar1[3] = 'q';
      *(undefined2 *)(local_470 + sVar25 + 8) = 0x5f;
    }
    if (pTVar33[uVar36].type == MF_WEAPON_PLACEHOLDER) {
      local_470._4_4_ = 0x61655724;
      unique0x100017bf = (pointer)0x246761546e6f70;
      local_470._0_4_ = MF_WEAPON_PLACEHOLDER|MF_NORMAL_MASKED_TS;
      local_5b8.super_BaseProcess._vptr_BaseProcess = (_func_int **)0x0;
      local_5b8.super_BaseProcess.shared =
           (SharedPostProcessInfo *)((ulong)local_5b8.super_BaseProcess.shared & 0xffffffff00000000)
      ;
    }
    aiMaterial::AddBinaryProperty(this_02,&local_5b8,0xc,"$clr.diffuse",0,0,aiPTI_Float);
    sVar25 = strlen(__s);
    local_470._0_4_ = (undefined4)sVar25;
    aiMaterial::AddProperty(this_02,(aiString *)local_470,"?mat.name",0,0);
    _Var4._M_p = stack0xfffffffffffffb98;
    if (local_578.
        super__Vector_base<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_578.
        super__Vector_base<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      ppVar26 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_578.
                   super__Vector_base<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      do {
        if (*(uint *)&(ppVar26->first)._M_dataplus._M_p ==
            local_5d8.
            super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar36].tex) {
          uVar38 = (ppVar26->first).field_2._M_allocated_capacity;
          if (uVar38 < 0x400) {
            local_470._0_4_ = (undefined4)uVar38;
            memcpy(__s,(void *)(ppVar26->first)._M_string_length,uVar38);
            local_470[uVar38 + 4] = 0;
          }
          aiMaterial::AddProperty(this_02,(aiString *)local_470,"$tex.file",1,0);
          _Var4._M_p = stack0xfffffffffffffb98;
          break;
        }
        ppVar26 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&(ppVar26->second)._M_string_length;
      } while (ppVar26 !=
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_578.
                  super__Vector_base<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
    }
    acStack_464 = SUB84((ulong)_Var4._M_p >> 0x20,0);
    uVar36 = uVar36 + 1;
    if (pScene_00->mNumMeshes <= uVar36) {
      if (local_560.
          super__Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_560.
          super__Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        pTVar34 = local_560.
                  super__Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          local_470._0_4_ = SEXT14(pTVar34->mType);
          local_470._4_4_ = ZEXT14(pTVar34->mTextureNum);
          local_470._8_4_ = 0;
          _Var17 = std::
                   __find_if<__gnu_cxx::__normal_iterator<Assimp::Unreal::TempMat*,std::vector<Assimp::Unreal::TempMat,std::allocator<Assimp::Unreal::TempMat>>>,__gnu_cxx::__ops::_Iter_equals_val<Assimp::Unreal::TempMat_const>>
                             (local_5d8.
                              super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              local_5d8.
                              super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                              ._M_impl.super__Vector_impl_data._M_finish,local_470);
          paVar21 = pScene_00->mMeshes
                    [((ulong)((long)_Var17._M_current -
                             (long)local_5d8.
                                   super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                     0xaaaaaaaaaaaaaab];
          paVar23 = paVar21->mFaces;
          uVar15 = paVar21->mNumFaces;
          paVar21->mNumFaces = uVar15 + 1;
          paVar23[uVar15].mNumIndices = 3;
          puVar20 = (uint *)operator_new__(0xc);
          _Var4._M_p = (pointer)CONCAT44(acStack_464,local_470._8_4_);
          paVar23[uVar15].mIndices = puVar20;
          uVar29 = paVar21->mNumVertices;
          lVar35 = 0;
          do {
            paVar23[uVar15].mIndices[lVar35] = uVar29;
            uVar10 = pTVar34->mVertex[lVar35];
            paVar24 = paVar21->mVertices;
            uVar29 = paVar21->mNumVertices;
            paVar24[uVar29].z =
                 local_488.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar10].z;
            fVar5 = local_488.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar10].y;
            paVar24 = paVar24 + uVar29;
            paVar24->x = local_488.
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar10].x;
            paVar24->y = fVar5;
            bVar9 = pTVar34->mTex[lVar35][1];
            paVar24 = paVar21->mTextureCoords[0];
            uVar29 = paVar21->mNumVertices;
            paVar24[uVar29].x = (float)pTVar34->mTex[lVar35][0] / 255.0;
            paVar24[uVar29].y = 1.0 - (float)bVar9 / 255.0;
            paVar24[uVar29].z = 0.0;
            lVar35 = lVar35 + 1;
            uVar29 = paVar21->mNumVertices + 1;
            paVar21->mNumVertices = uVar29;
          } while (lVar35 != 3);
          pTVar34 = pTVar34 + 1;
          pScene_00 = local_5c0;
        } while (pTVar34 !=
                 local_560.
                 super__Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      unique0x10002f3e = _Var4._M_p;
      MakeLeftHandedProcess::MakeLeftHandedProcess((MakeLeftHandedProcess *)local_470);
      MakeLeftHandedProcess::Execute((MakeLeftHandedProcess *)local_470,pScene_00);
      FlipWindingOrderProcess::FlipWindingOrderProcess(&local_5b8);
      FlipWindingOrderProcess::Execute(&local_5b8,pScene_00);
      FlipWindingOrderProcess::~FlipWindingOrderProcess(&local_5b8);
      MakeLeftHandedProcess::~MakeLeftHandedProcess((MakeLeftHandedProcess *)local_470);
      if (local_5d8.
          super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_5d8.
                        super__Vector_base<Assimp::Unreal::TempMat,_std::allocator<Assimp::Unreal::TempMat>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (stream != (IOStream *)0x0) {
        (*stream->_vptr_IOStream[1])(stream);
      }
      std::
      vector<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&local_578);
      if (local_488.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_488.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      StreamReader<false,_false>::~StreamReader(&local_68);
      if (local_560.
          super__Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_560.
                        super__Vector_base<Assimp::Unreal::Triangle,_std::allocator<Assimp::Unreal::Triangle>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      StreamReader<false,_false>::~StreamReader(&local_548);
      (**(code **)(*local_580 + 8))();
      if (local_4b0 != local_4a0) {
        operator_delete(local_4b0);
      }
      if (local_4f0 != local_4e0) {
        operator_delete(local_4f0);
      }
      if (local_4d0 != local_4c0) {
        operator_delete(local_4d0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_510._M_dataplus._M_p != &local_510.field_2) {
        operator_delete(local_510._M_dataplus._M_p);
      }
      return;
    }
  } while( true );
}

Assistant:

void UnrealImporter::InternReadFile( const std::string& pFile,
    aiScene* pScene, IOSystem* pIOHandler)
{
    // For any of the 3 files being passed get the three correct paths
    // First of all, determine file extension
    std::string::size_type pos = pFile.find_last_of('.');
    std::string extension = GetExtension(pFile);

    std::string d_path,a_path,uc_path;
    if (extension == "3d")      {
        // jjjj_d.3d
        // jjjj_a.3d
        pos = pFile.find_last_of('_');
        if (std::string::npos == pos) {
            throw DeadlyImportError("UNREAL: Unexpected naming scheme");
        }
        extension = pFile.substr(0,pos);
    }
    else {
        extension = pFile.substr(0,pos);
    }

    // build proper paths
    d_path  = extension+"_d.3d";
    a_path  = extension+"_a.3d";
    uc_path = extension+".uc";

    ASSIMP_LOG_DEBUG_F( "UNREAL: data file is ", d_path);
    ASSIMP_LOG_DEBUG_F("UNREAL: aniv file is ", a_path);
    ASSIMP_LOG_DEBUG_F("UNREAL: uc file is ", uc_path);

    // and open the files ... we can't live without them
    std::unique_ptr<IOStream> p(pIOHandler->Open(d_path));
    if (!p)
        throw DeadlyImportError("UNREAL: Unable to open _d file");
    StreamReaderLE d_reader(pIOHandler->Open(d_path));

    const uint16_t numTris = d_reader.GetI2();
    const uint16_t numVert = d_reader.GetI2();
    d_reader.IncPtr(44);
    if (!numTris || numVert < 3)
        throw DeadlyImportError("UNREAL: Invalid number of vertices/triangles");

    // maximum texture index
    unsigned int maxTexIdx = 0;

    // collect triangles
    std::vector<Unreal::Triangle> triangles(numTris);
    for (auto & tri : triangles) {
        for (unsigned int i = 0; i < 3;++i) {

            tri.mVertex[i] = d_reader.GetI2();
            if (tri.mVertex[i] >= numTris)  {
                ASSIMP_LOG_WARN("UNREAL: vertex index out of range");
                tri.mVertex[i] = 0;
            }
        }
        tri.mType = d_reader.GetI1();

        // handle mesh flagss?
        if (configHandleFlags)
            tri.mType = Unreal::MF_NORMAL_OS;
        else {
            // ignore MOD and MASKED for the moment, treat them as two-sided
            if (tri.mType == Unreal::MF_NORMAL_MOD_TS || tri.mType == Unreal::MF_NORMAL_MASKED_TS)
                tri.mType = Unreal::MF_NORMAL_TS;
        }
        d_reader.IncPtr(1);

        for (unsigned int i = 0; i < 3;++i)
            for (unsigned int i2 = 0; i2 < 2;++i2)
                tri.mTex[i][i2] = d_reader.GetI1();

        tri.mTextureNum = d_reader.GetI1();
        maxTexIdx = std::max(maxTexIdx,(unsigned int)tri.mTextureNum);
        d_reader.IncPtr(1);
    }

    p.reset(pIOHandler->Open(a_path));
    if (!p)
        throw DeadlyImportError("UNREAL: Unable to open _a file");
    StreamReaderLE a_reader(pIOHandler->Open(a_path));

    // read number of frames
    const uint32_t numFrames = a_reader.GetI2();
    if (configFrameID >= numFrames)
        throw DeadlyImportError("UNREAL: The requested frame does not exist");

    uint32_t st = a_reader.GetI2();
    if (st != numVert*4)
        throw DeadlyImportError("UNREAL: Unexpected aniv file length");

    // skip to our frame
    a_reader.IncPtr(configFrameID *numVert*4);

    // collect vertices
    std::vector<aiVector3D> vertices(numVert);
    for (auto &vertex : vertices)    {
        int32_t val = a_reader.GetI4();
        Unreal::DecompressVertex(vertex ,val);
    }

    // list of textures.
    std::vector< std::pair<unsigned int, std::string> > textures;

    // allocate the output scene
    aiNode* nd = pScene->mRootNode = new aiNode();
    nd->mName.Set("<UnrealRoot>");

    // we can live without the uc file if necessary
    std::unique_ptr<IOStream> pb (pIOHandler->Open(uc_path));
    if (pb.get())   {

        std::vector<char> _data;
        TextFileToBuffer(pb.get(),_data);
        const char* data = &_data[0];

        std::vector< std::pair< std::string,std::string > > tempTextures;

        // do a quick search in the UC file for some known, usually texture-related, tags
        for (;*data;++data) {
            if (TokenMatchI(data,"#exec",5))    {
                SkipSpacesAndLineEnd(&data);

                // #exec TEXTURE IMPORT [...] NAME=jjjjj [...] FILE=jjjj.pcx [...]
                if (TokenMatchI(data,"TEXTURE",7))  {
                    SkipSpacesAndLineEnd(&data);

                    if (TokenMatchI(data,"IMPORT",6))   {
                        tempTextures.push_back(std::pair< std::string,std::string >());
                        std::pair< std::string,std::string >& me = tempTextures.back();
                        for (;!IsLineEnd(*data);++data) {
                            if (!::ASSIMP_strincmp(data,"NAME=",5)) {
                                const char *d = data+=5;
                                for (;!IsSpaceOrNewLine(*data);++data);
                                me.first = std::string(d,(size_t)(data-d));
                            }
                            else if (!::ASSIMP_strincmp(data,"FILE=",5))    {
                                const char *d = data+=5;
                                for (;!IsSpaceOrNewLine(*data);++data);
                                me.second = std::string(d,(size_t)(data-d));
                            }
                        }
                        if (!me.first.length() || !me.second.length())
                            tempTextures.pop_back();
                    }
                }
                // #exec MESHMAP SETTEXTURE MESHMAP=box NUM=1 TEXTURE=Jtex1
                // #exec MESHMAP SCALE MESHMAP=box X=0.1 Y=0.1 Z=0.2
                else if (TokenMatchI(data,"MESHMAP",7)) {
                    SkipSpacesAndLineEnd(&data);

                    if (TokenMatchI(data,"SETTEXTURE",10)) {

                        textures.push_back(std::pair<unsigned int, std::string>());
                        std::pair<unsigned int, std::string>& me = textures.back();

                        for (;!IsLineEnd(*data);++data) {
                            if (!::ASSIMP_strincmp(data,"NUM=",4))  {
                                data += 4;
                                me.first = strtoul10(data,&data);
                            }
                            else if (!::ASSIMP_strincmp(data,"TEXTURE=",8)) {
                                data += 8;
                                const char *d = data;
                                for (;!IsSpaceOrNewLine(*data);++data);
                                me.second = std::string(d,(size_t)(data-d));

                                // try to find matching path names, doesn't care if we don't find them
                                for (std::vector< std::pair< std::string,std::string > >::const_iterator it = tempTextures.begin();
                                     it != tempTextures.end(); ++it)    {
                                    if ((*it).first == me.second)   {
                                        me.second = (*it).second;
                                        break;
                                    }
                                }
                            }
                        }
                    }
                    else if (TokenMatchI(data,"SCALE",5)) {

                        for (;!IsLineEnd(*data);++data) {
                            if (data[0] == 'X' && data[1] == '=')   {
                                data = fast_atoreal_move<float>(data+2,(float&)nd->mTransformation.a1);
                            }
                            else if (data[0] == 'Y' && data[1] == '=')  {
                                data = fast_atoreal_move<float>(data+2,(float&)nd->mTransformation.b2);
                            }
                            else if (data[0] == 'Z' && data[1] == '=')  {
                                data = fast_atoreal_move<float>(data+2,(float&)nd->mTransformation.c3);
                            }
                        }
                    }
                }
            }
        }
    }
    else    {
        ASSIMP_LOG_ERROR("Unable to open .uc file");
    }

    std::vector<Unreal::TempMat> materials;
    materials.reserve(textures.size()*2+5);

    // find out how many output meshes and materials we'll have and build material indices
	for (Unreal::Triangle &tri : triangles) {
        Unreal::TempMat mat(tri);
        std::vector<Unreal::TempMat>::iterator nt = std::find(materials.begin(),materials.end(),mat);
        if (nt == materials.end()) {
            // add material
            tri.matIndex = static_cast<unsigned int>(materials.size());
            mat.numFaces = 1;
            materials.push_back(mat);

            ++pScene->mNumMeshes;
        }
        else {
            tri.matIndex = static_cast<unsigned int>(nt-materials.begin());
            ++nt->numFaces;
        }
    }

    if (!pScene->mNumMeshes) {
        throw DeadlyImportError("UNREAL: Unable to find valid mesh data");
    }

    // allocate meshes and bind them to the node graph
    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];
    pScene->mMaterials = new aiMaterial*[pScene->mNumMaterials = pScene->mNumMeshes];

    nd->mNumMeshes  = pScene->mNumMeshes;
    nd->mMeshes = new unsigned int[nd->mNumMeshes];
    for (unsigned int i = 0; i < pScene->mNumMeshes;++i) {
        aiMesh* m = pScene->mMeshes[i] =  new aiMesh();
        m->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

        const unsigned int num = materials[i].numFaces;
        m->mFaces            = new aiFace     [num];
        m->mVertices         = new aiVector3D [num*3];
        m->mTextureCoords[0] = new aiVector3D [num*3];

        nd->mMeshes[i] = i;

        // create materials, too
        aiMaterial* mat = new aiMaterial();
        pScene->mMaterials[i] = mat;

        // all white by default - texture rulez
        aiColor3D color(1.f,1.f,1.f);

        aiString s;
        ::ai_snprintf( s.data, MAXLEN, "mat%u_tx%u_",i,materials[i].tex );

        // set the two-sided flag
        if (materials[i].type == Unreal::MF_NORMAL_TS) {
            const int twosided = 1;
            mat->AddProperty(&twosided,1,AI_MATKEY_TWOSIDED);
            ::strcat(s.data,"ts_");
        }
        else ::strcat(s.data,"os_");

        // make TRANS faces 90% opaque that RemRedundantMaterials won't catch us
        if (materials[i].type == Unreal::MF_NORMAL_TRANS_TS)    {
            const float opac = 0.9f;
            mat->AddProperty(&opac,1,AI_MATKEY_OPACITY);
            ::strcat(s.data,"tran_");
        }
        else ::strcat(s.data,"opaq_");

        // a special name for the weapon attachment point
        if (materials[i].type == Unreal::MF_WEAPON_PLACEHOLDER) {
            s.length = ::ai_snprintf( s.data, MAXLEN, "$WeaponTag$" );
            color = aiColor3D(0.f,0.f,0.f);
        }

        // set color and name
        mat->AddProperty(&color,1,AI_MATKEY_COLOR_DIFFUSE);
        s.length = ::strlen(s.data);
        mat->AddProperty(&s,AI_MATKEY_NAME);

        // set texture, if any
        const unsigned int tex = materials[i].tex;
        for (std::vector< std::pair< unsigned int, std::string > >::const_iterator it = textures.begin();it != textures.end();++it) {
            if ((*it).first == tex) {
                s.Set((*it).second);
                mat->AddProperty(&s,AI_MATKEY_TEXTURE_DIFFUSE(0));
                break;
            }
        }
    }

    // fill them.
    for (const Unreal::Triangle &tri : triangles) {
        Unreal::TempMat mat(tri);
        std::vector<Unreal::TempMat>::iterator nt = std::find(materials.begin(),materials.end(),mat);

        aiMesh* mesh = pScene->mMeshes[nt-materials.begin()];
        aiFace& f    = mesh->mFaces[mesh->mNumFaces++];
        f.mIndices   = new unsigned int[f.mNumIndices = 3];

        for (unsigned int i = 0; i < 3;++i,mesh->mNumVertices++) {
            f.mIndices[i] = mesh->mNumVertices;

            mesh->mVertices[mesh->mNumVertices] = vertices[ tri.mVertex[i] ];
            mesh->mTextureCoords[0][mesh->mNumVertices] = aiVector3D( tri.mTex[i][0] / 255.f, 1.f - tri.mTex[i][1] / 255.f, 0.f);
        }
    }

    // convert to RH
    MakeLeftHandedProcess hero;
    hero.Execute(pScene);

    FlipWindingOrderProcess flipper;
    flipper.Execute(pScene);
}